

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileStream.cpp
# Opt level: O1

void __thiscall
TPZFileStream::ReadData<TFad<1,double>>(TPZFileStream *this,TFad<1,_double> *p,int howMany)

{
  ifstream *piVar1;
  ulong uVar2;
  char buf [100];
  undefined1 auStack_88 [104];
  
  if (((&this->field_0x28)[*(long *)(*(long *)&this->fIn + -0x18)] & 5) != 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Save/TPZFileStream.cpp"
               ,0x45);
  }
  piVar1 = &this->fIn;
  if (howMany != 0) {
    if (0 < howMany) {
      uVar2 = (ulong)(uint)howMany;
      do {
        std::istream::_M_extract<double>((double *)piVar1);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
    std::istream::getline((char *)piVar1,(long)auStack_88,'d');
  }
  return;
}

Assistant:

void TPZFileStream::ReadData(T *p, int howMany) {
        int c;
        char buf[100];
        if(!fIn)
        {
            DebugStop();
        }
        if(howMany)
        {
            for(c=0; c<howMany; c++) fIn >> p[c];
            fIn.getline(buf,100);
        }
#ifdef PZDEBUG
        if (fIn.bad()) {
            PZError << "TFileStream:Could not read from stream" << std::endl;
            DebugStop();
        }
#endif
    }